

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

char * getTypedProperty<char_const*>
                 (cmGeneratorTarget *tgt,string *prop,
                 cmGeneratorExpressionInterpreter *genexInterpreter)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmValue cVar2;
  string *psVar3;
  pointer pcVar4;
  string local_40;
  
  cVar2 = cmGeneratorTarget::GetProperty(tgt,prop);
  if (genexInterpreter == (cmGeneratorExpressionInterpreter *)0x0) {
    if (cVar2.Value == (string *)0x0) {
      pcVar4 = (pointer)0x0;
    }
    else {
      pcVar4 = ((cVar2.Value)->_M_dataplus)._M_p;
    }
  }
  else {
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    if (cVar2.Value == (string *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    }
    else {
      pcVar4 = ((cVar2.Value)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar4,pcVar4 + (cVar2.Value)->_M_string_length);
    }
    psVar3 = cmGeneratorExpressionInterpreter::Evaluate(genexInterpreter,&local_40,prop);
    pcVar4 = (psVar3->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return pcVar4;
}

Assistant:

const char* getTypedProperty<const char*>(
  cmGeneratorTarget const* tgt, const std::string& prop,
  cmGeneratorExpressionInterpreter* genexInterpreter)
{
  cmValue value = tgt->GetProperty(prop);

  if (genexInterpreter == nullptr) {
    return value.GetCStr();
  }

  return genexInterpreter->Evaluate(value ? *value : "", prop).c_str();
}